

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cctest.cc
# Opt level: O3

void PrintTestList(CcTest *current)

{
  if (current == (CcTest *)0x0) {
    return;
  }
  PrintTestList(current->prev_);
  if (current->dependency_ != (char *)0x0) {
    printf("%s/%s<%s\n",current->file_,current->name_);
    return;
  }
  printf("%s/%s<\n",current->file_,current->name_);
  return;
}

Assistant:

static void PrintTestList(CcTest* current) {
  if (current == NULL) return;
  PrintTestList(current->prev());
  if (current->dependency() != NULL) {
    printf("%s/%s<%s\n",
           current->file(), current->name(), current->dependency());
  } else {
    printf("%s/%s<\n", current->file(), current->name());
  }
}